

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_relu_impl(ggml_context *ctx,ggml_tensor *a,_Bool inplace)

{
  bool bVar1;
  ggml_tensor *pgVar2;
  byte in_DL;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  _Bool is_node;
  ggml_tensor *in_stack_ffffffffffffffc8;
  ggml_context *in_stack_ffffffffffffffd0;
  ggml_tensor *local_28;
  
  bVar1 = false;
  if (((in_DL & 1) == 0) && (in_RSI->grad != (ggml_tensor *)0x0)) {
    bVar1 = true;
  }
  if ((in_DL & 1) == 0) {
    local_28 = ggml_dup_tensor(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else {
    local_28 = ggml_view_tensor(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  local_28->op = GGML_OP_RELU;
  if (bVar1) {
    pgVar2 = ggml_dup_tensor(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else {
    pgVar2 = (ggml_tensor *)0x0;
  }
  local_28->grad = pgVar2;
  local_28->src0 = in_RSI;
  local_28->src1 = (ggml_tensor *)0x0;
  return local_28;
}

Assistant:

struct ggml_tensor * ggml_relu_impl(
        struct ggml_context * ctx,
        struct ggml_tensor * a,
        bool inplace) {
    bool is_node = false;

    if (!inplace && (a->grad)) {
        is_node = true;
    }

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    result->op   = GGML_OP_RELU;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = NULL;

    return result;
}